

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxColorLiteral::FxColorLiteral(FxColorLiteral *this,FArgumentList *args,FScriptPosition *sc)

{
  FScriptPosition *sc_local;
  FArgumentList *args_local;
  FxColorLiteral *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ColorLiteral,sc);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxColorLiteral_00a0b3b8;
  TDeletingArray<FxExpression_*,_FxExpression_*>::TDeletingArray(&this->ArgList);
  this->constval = 0;
  TDeletingArray<FxExpression_*,_FxExpression_*>::operator=(&this->ArgList,args);
  return;
}

Assistant:

FxColorLiteral::FxColorLiteral(FArgumentList &args, FScriptPosition &sc)
	:FxExpression(EFX_ColorLiteral, sc)
{
	ArgList = std::move(args);
}